

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

void wiz_hack_map(chunk *c,player *p,_func_void_chunk_ptr_void_ptr_loc__Bool_ptr_uint8_t_ptr *func,
                 void *closure)

{
  _Bool _Var1;
  loc grid;
  term *ptVar2;
  int iVar3;
  wchar_t wVar4;
  wchar_t x;
  wchar_t y;
  uint8_t color;
  _Bool show;
  player *local_48;
  _func_void_chunk_ptr_void_ptr_loc__Bool_ptr_uint8_t_ptr *local_40;
  void *local_38;
  
  iVar3 = Term->sidebar_mode;
  wVar4 = Term->offset_y;
  ptVar2 = Term;
  local_48 = p;
  local_40 = func;
  local_38 = closure;
  for (y = wVar4;
      y < (ptVar2->hgt - (row_top_map[iVar3] + row_bottom_map[iVar3])) / (int)(uint)tile_height +
          wVar4; y = y + L'\x01') {
    wVar4 = ptVar2->offset_x;
    for (x = wVar4; x < (~col_map[iVar3] + ptVar2->wid) / (int)(uint)tile_width + wVar4;
        x = x + L'\x01') {
      grid = (loc)loc(x,y);
      _Var1 = square_in_bounds_fully((chunk_conflict *)c,grid);
      if (_Var1) {
        (*local_40)(c,local_38,grid,&show,&color);
        if (show == true) {
          _Var1 = loc_eq((loc_conflict)grid,local_48->grid);
          if (_Var1) {
            wVar4 = L'@';
          }
          else {
            _Var1 = square_ispassable((chunk_conflict *)c,grid);
            if (_Var1) {
              wVar4 = L'*';
            }
            else {
              wVar4 = L'#';
            }
          }
          print_rel(wVar4,color,y,x);
        }
      }
      iVar3 = Term->sidebar_mode;
      wVar4 = Term->offset_x;
      ptVar2 = Term;
    }
    wVar4 = ptVar2->offset_y;
  }
  return;
}

Assistant:

static void wiz_hack_map(struct chunk *c, struct player *p,
	void (*func)(struct chunk *, void *, struct loc, bool *, uint8_t *),
	void *closure)
{
	int y;

	for (y = Term->offset_y; y < Term->offset_y + SCREEN_HGT; y++) {
		int x;

		for (x = Term->offset_x; x < Term->offset_x + SCREEN_WID; x++) {
			struct loc grid = loc(x, y);
			bool show;
			uint8_t color;

			if (!square_in_bounds_fully(c, grid)) continue;

			(*func)(c, closure, grid, &show, &color);
			if (!show) continue;

			if (loc_eq(grid, p->grid)) {
				print_rel(L'@', color, y, x);
			} else if (square_ispassable(c, grid)) {
				print_rel(L'*', color, y, x);
			} else {
				print_rel(L'#', color, y, x);
			}
		}
	}
}